

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall defaultUnits_dimensions_Test::TestBody(defaultUnits_dimensions_Test *this)

{
  bool bVar1;
  char *pcVar2;
  precise_unit *units;
  precise_unit *units_00;
  unit *units_01;
  precise_unit *units_02;
  precise_unit *units_03;
  double __x;
  double in_XMM1_Qa;
  AssertHelper local_1f0;
  Message local_1e8;
  double local_1e0 [2];
  string local_1d0;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_4;
  Message local_198;
  precise_unit local_190;
  string local_180;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_3;
  Message local_148;
  string local_140;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_2;
  Message local_108;
  allocator local_f9;
  string local_f8;
  precise_unit local_d8;
  string local_c8;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_1;
  Message local_90 [3];
  allocator local_71;
  string local_70;
  precise_unit local_50;
  string local_40;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  defaultUnits_dimensions_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"length",&local_71);
  local_50 = ::units::default_unit(&local_70);
  ::units::dimensions_abi_cxx11_(&local_40,(units *)&local_50,units);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[9],_nullptr>
            ((EqHelper *)local_20,"dimensions(default_unit(\"length\"))","\"[length]\"",&local_40,
             (char (*) [9])"[length]");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x6b6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"area",&local_f9);
  local_d8 = ::units::default_unit(&local_f8);
  ::units::dimensions_abi_cxx11_(&local_c8,(units *)&local_d8,units_00);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[7],_nullptr>
            ((EqHelper *)local_a8,"dimensions(default_unit(\"area\"))","\"[area]\"",&local_c8,
             (char (*) [7])"[area]");
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x6b7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  ::units::dimensions_abi_cxx11_(&local_140,(units *)&::units::ft,units_01);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[9],_nullptr>
            ((EqHelper *)local_120,"dimensions(ft)","\"[length]\"",&local_140,
             (char (*) [9])"[length]");
  std::__cxx11::string::~string((string *)&local_140);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_148);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x6b8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  local_190 = ::units::precise_unit::operator*
                        ((precise_unit *)::units::precise::pu,(precise_unit *)::units::precise::MW);
  ::units::dimensions_abi_cxx11_(&local_180,(units *)&local_190,units_02);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[16],_nullptr>
            ((EqHelper *)local_160,"dimensions(precise::pu * precise::MW)","\"[dimensionless]\"",
             &local_180,(char (*) [16])"[dimensionless]");
  std::__cxx11::string::~string((string *)&local_180);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x6b9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  local_1e0[0] = ::units::precise_unit::pow((precise_unit *)::units::precise::MW,__x,in_XMM1_Qa);
  ::units::dimensions_abi_cxx11_(&local_1d0,(units *)local_1e0,units_03);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[10],_nullptr>
            ((EqHelper *)local_1b0,"dimensions(precise::MW.pow(2))","\"[unknown]\"",&local_1d0,
             (char (*) [10])"[unknown]");
  std::__cxx11::string::~string((string *)&local_1d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x6ba,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  return;
}

Assistant:

TEST(defaultUnits, dimensions)
{
    EXPECT_EQ(dimensions(default_unit("length")), "[length]");
    EXPECT_EQ(dimensions(default_unit("area")), "[area]");
    EXPECT_EQ(dimensions(ft), "[length]");
    EXPECT_EQ(dimensions(precise::pu * precise::MW), "[dimensionless]");
    EXPECT_EQ(dimensions(precise::MW.pow(2)), "[unknown]");
}